

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Socket::Socket(Socket *this,type stype)

{
  int __protocol;
  int iVar1;
  runtime_error *this_00;
  anon_enum_32 proto;
  __socket_type type;
  type stype_local;
  Socket *this_local;
  
  this->SocketFileDescriptor = -1;
  std::__cxx11::string::string((string *)&this->RemoteIp);
  iVar1 = 1;
  if (stype == UDP) {
    iVar1 = 2;
  }
  __protocol = 6;
  if (stype == UDP) {
    __protocol = 0x11;
  }
  iVar1 = socket(2,iVar1,__protocol);
  this->SocketFileDescriptor = iVar1;
  if (iVar1 == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"system error - socket() failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Socket::Socket(Socket::type stype) {
  auto type = (stype == Socket::type::UDP) ? SOCK_DGRAM : SOCK_STREAM;
  auto proto = (stype == Socket::type::UDP) ? IPPROTO_UDP : IPPROTO_TCP;

  if ((SocketFileDescriptor = socket(AF_INET, type, proto)) == -1) {
    //LOG(IPC, Sev::Error, "socket() failed");
    throw std::runtime_error("system error - socket() failed");
  }
}